

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ringbuf.c
# Opt level: O3

adt_rbfh_t * adt_rbfh_newEx(uint8_t u8ElemSize,uint16_t u16MinNumElems,uint16_t u16MaxNumElems)

{
  adt_buf_err_t aVar1;
  adt_rbfh_t *self;
  
  self = (adt_rbfh_t *)malloc(0x20);
  if (self != (adt_rbfh_t *)0x0) {
    aVar1 = adt_rbfh_createEx(self,u8ElemSize,u16MinNumElems,u16MaxNumElems);
    if (aVar1 == '\0') {
      return self;
    }
    free(self);
  }
  return (adt_rbfh_t *)0x0;
}

Assistant:

adt_rbfh_t *adt_rbfh_newEx(uint8_t u8ElemSize, uint16_t u16MinNumElems, uint16_t u16MaxNumElems)
{
   adt_rbfh_t *self = (adt_rbfh_t*) malloc(sizeof(adt_rbfh_t));
   if (self != 0)
   {
      adt_buf_err_t result = adt_rbfh_createEx(self, u8ElemSize, u16MinNumElems, u16MaxNumElems);
      if (result != BUF_E_OK)
      {
         free(self);
         self = (adt_rbfh_t*) 0;
      }
   }
   return self;
}